

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEditPrivate::updateViewport(QPlainTextEditPrivate *this)

{
  long lVar1;
  QPlainTextEdit *this_00;
  QPlainTextEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QPlainTextEdit *q;
  QPlainTextEdit *pQVar2;
  QWidget *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  QWidget::update((QWidget *)in_RDI);
  pQVar2 = this_00;
  QWidget::rect(in_stack_ffffffffffffffe8);
  QPlainTextEdit::updateRequest(this_00,(QRect *)in_RDI,(int)((ulong)pQVar2 >> 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEditPrivate::updateViewport()
{
    Q_Q(QPlainTextEdit);
    viewport->update();
    emit q->updateRequest(viewport->rect(), 0);
}